

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Game.cpp
# Opt level: O2

void __thiscall Game::Game(Game *this)

{
  bool bVar1;
  ostream *poVar2;
  Memento *mem;
  Deal *this_00;
  Player *this_01;
  long lVar3;
  int player_type;
  char *ctx;
  Game *pGVar4;
  string *__rhs;
  allocator local_122;
  allocator local_121;
  Game *local_120;
  string name;
  string list [4];
  string local_70;
  allocator local_50 [32];
  
  local_120 = this;
  AdvancedConsole::Cursor::Cursor((Cursor *)list,0,0,AC_ABSOLUTE);
  poVar2 = AdvancedConsole::operator<<((ostream *)&std::cout,(Cursor *)list);
  AdvancedConsole::Erase::Erase((Erase *)&name,AC_ALL,AC_SCREEN);
  AdvancedConsole::operator<<(poVar2,(Erase *)&name);
  poVar2 = std::operator<<((ostream *)&std::cout,"Welcome to the Bridge Game.");
  poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
  std::endl<char,std::char_traits<char>>(poVar2);
  mem = Memento::loadFile(-1);
  if (mem == (Memento *)0x0) {
LAB_0010680d:
    poVar2 = std::operator<<((ostream *)&std::cout,
                             "You should choose either player is a human or a computer. ");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"If it is a computer, just press ENTER.");
    std::endl<char,std::char_traits<char>>(poVar2);
    poVar2 = std::operator<<((ostream *)&std::cout,"If it is a human, just type the player name.");
    poVar2 = std::endl<char,std::char_traits<char>>(poVar2);
    std::endl<char,std::char_traits<char>>(poVar2);
    __rhs = list;
    std::__cxx11::string::string((string *)__rhs,"North",(allocator *)&name);
    std::__cxx11::string::string((string *)(list + 1),"East",local_50);
    std::__cxx11::string::string((string *)(list + 2),"South",&local_121);
    ctx = "West";
    std::__cxx11::string::string((string *)(list + 3),"West",&local_122);
    name._M_dataplus._M_p = (pointer)&name.field_2;
    name._M_string_length = 0;
    name.field_2._M_local_buf[0] = '\0';
    for (lVar3 = 0; pGVar4 = local_120, lVar3 != 4; lVar3 = lVar3 + 1) {
      poVar2 = std::operator<<((ostream *)&std::cout,"Player ");
      poVar2 = std::operator<<(poVar2,(string *)__rhs);
      std::operator<<(poVar2," : ");
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&std::cin,(string *)&name);
      if (name._M_string_length == 0) {
LAB_00106959:
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_50
                       ,"Computer ",__rhs);
        std::__cxx11::string::operator=((string *)&name,(string *)local_50);
        pGVar4 = (Game *)local_50;
        std::__cxx11::string::~string((string *)local_50);
        player_type = 1;
      }
      else {
        pGVar4 = (Game *)&name;
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&name,"computer");
        player_type = 0;
        if (bVar1) goto LAB_00106959;
      }
      this_01 = createPlayer(pGVar4,player_type);
      (local_120->_players)._M_elems[lVar3] = this_01;
      std::__cxx11::string::string((string *)&local_70,(string *)&name);
      ctx = (char *)&local_70;
      Player::setName(this_01,&local_70);
      std::__cxx11::string::~string((string *)&local_70);
      __rhs = __rhs + 1;
    }
    init(local_120,(EVP_PKEY_CTX *)ctx);
    makeMemento(pGVar4);
    std::__cxx11::string::~string((string *)&name);
    lVar3 = 0x60;
    do {
      std::__cxx11::string::~string((string *)((long)&list[0]._M_dataplus._M_p + lVar3));
      lVar3 = lVar3 + -0x20;
    } while (lVar3 != -0x20);
  }
  else {
    poVar2 = std::operator<<((ostream *)&std::cout,"Do you want to load last game?");
    std::endl<char,std::char_traits<char>>(poVar2);
    list[0]._M_dataplus._M_p = (pointer)&list[0].field_2;
    list[0]._M_string_length = 0;
    list[0].field_2._M_local_buf[0] = '\0';
    std::operator<<((ostream *)&std::cout,"Yes(y) or No(n) : ");
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)&std::cin,(string *)list);
    bVar1 = std::operator==(list,"y");
    if (!bVar1) {
      bVar1 = std::operator==(list,"Y");
      if (!bVar1) {
        bVar1 = std::operator==(list,"yes");
        if (!bVar1) {
          bVar1 = std::operator==(list,"YES");
          if (!bVar1) {
            std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
            std::__cxx11::string::~string((string *)list);
            goto LAB_0010680d;
          }
        }
      }
    }
    reset(local_120,mem);
    this_00 = (Deal *)operator_new(0x48);
    pGVar4 = local_120;
    Deal::Deal(this_00,(array<Player_*,_4UL>)*&(local_120->_players)._M_elems,0);
    pGVar4->_currentDeal = this_00;
    Deal::reset(this_00,mem);
    std::__cxx11::string::~string((string *)list);
  }
  return;
}

Assistant:

Game::Game() {
    cout << AdvancedConsole::Cursor(0, 0) << AdvancedConsole::Erase();
    cout << "Welcome to the Bridge Game." << endl << endl;

    Memento *mem = Memento::loadFile();
    if (mem) {
        cout << "Do you want to load last game?" << endl;
        string q;
        cout << "Yes(y) or No(n) : ";
        getline(std::cin, q);
        if (q == "y" || q == "Y" || q == "yes" || q == "YES") {
            this->reset(mem);
            _currentDeal = new Deal(_players, 0);
            _currentDeal->reset(mem);
            return;
        }
        cout << endl;
    }

    cout << "You should choose either player is a human or a computer. " << endl;
    cout << "If it is a computer, just press ENTER." << endl;
    cout << "If it is a human, just type the player name." << endl << endl;

    string list[4] = {"North", "East", "South", "West"};
    string name;
    for (int i = 0; i < 4; i++) {
        cout << "Player " << list[i] << " : ";
        getline(std::cin, name);
        bool isComputer = name.empty() || name == "computer";
        if (isComputer) name = "Computer " + list[i];

        _players[i] = createPlayer(isComputer);
        _players[i]->setName(name);
    }


    init();
    makeMemento();
}